

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::WatWriter::FlushExprTreeVector
          (WatWriter *this,
          vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
          *expr_trees)

{
  ExprType EVar1;
  pointer pEVar2;
  Expr *pEVar3;
  char *__function;
  long lVar4;
  ExprList *exprs;
  Expr *pEVar5;
  pointer pEVar6;
  ExprVisitor visitor;
  ExprVisitorDelegate delegate;
  ExprTree expr_tree;
  ExprVisitor local_d0;
  Delegate local_68;
  WatWriter *local_60;
  Expr *local_58;
  vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
  local_50;
  Index local_38;
  
  pEVar6 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pEVar2 = (expr_trees->
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar6 != pEVar2) {
    do {
      pEVar3 = pEVar6->expr;
      lVar4 = (long)(pEVar6->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pEVar6->children).
                    super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      local_50.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58 = pEVar3;
      local_50.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_start =
           std::
           _Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ::_M_allocate((_Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                          *)((lVar4 >> 3) * -0x3333333333333333),(size_t)expr_trees);
      local_50.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)(lVar4 + (long)local_50.
                                   super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
      local_50.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_50.
           super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_50.
      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           std::__uninitialized_copy<false>::
           __uninit_copy<__gnu_cxx::__normal_iterator<wabt::(anonymous_namespace)::ExprTree_const*,std::vector<wabt::(anonymous_namespace)::ExprTree,std::allocator<wabt::(anonymous_namespace)::ExprTree>>>,wabt::(anonymous_namespace)::ExprTree*>
                     ((pEVar6->children).
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (pEVar6->children).
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
                      local_50.
                      super__Vector_base<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      local_38 = pEVar6->result_count;
      EVar1 = pEVar3->type_;
      WritePuts(this,"(",None);
      if ((int)EVar1 < 0x1b) {
        if (EVar1 == Block) {
          if (pEVar3->type_ == Block) {
            Opcode::GetInfo((Info *)&local_d0,(Opcode *)&Opcode::Block_Opcode);
            WriteBeginBlock(this,Block,(Block *)(pEVar3 + 1),(char *)local_d0.delegate_);
            if (pEVar3->type_ == Block) {
LAB_0019304d:
              WriteFoldedExprList(this,(ExprList *)
                                       &pEVar3[5].super_intrusive_list_base<wabt::Expr>.prev_);
              FlushExprTreeStack(this);
              goto LAB_00193067;
            }
          }
          __function = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Block>, Base = wabt::Expr]"
          ;
LAB_0019312f:
          __assert_fail("isa<Derived>(base)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/cast.h"
                        ,0x48,__function);
        }
        if (EVar1 != If) goto LAB_00192f25;
        Opcode::GetInfo((Info *)&local_d0,(Opcode *)&Opcode::If_Opcode);
        WriteBeginBlock(this,If,(Block *)(pEVar3 + 1),(char *)local_d0.delegate_);
        FlushExprTreeVector(this,&local_50);
        WritePuts(this,"(",None);
        WritePuts(this,"then",Newline);
        this->indent_ = this->indent_ + 2;
        WriteFoldedExprList(this,(ExprList *)&pEVar3[5].super_intrusive_list_base<wabt::Expr>.prev_)
        ;
        FlushExprTreeStack(this);
        WriteClose(this,Newline);
        if (pEVar3[6].loc.filename._M_len != 0) {
          WritePuts(this,"(",None);
          WritePuts(this,"else",Newline);
          this->indent_ = this->indent_ + 2;
          WriteFoldedExprList(this,(ExprList *)&pEVar3[6].super_intrusive_list_base<wabt::Expr>);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
        }
LAB_00193067:
        expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      *)0x2;
        WriteClose(this,Newline);
        ModuleContext::EndBlock(&this->super_ModuleContext);
      }
      else {
        if (EVar1 == Loop) {
          if (pEVar3->type_ == Loop) {
            Opcode::GetInfo((Info *)&local_d0,(Opcode *)&Opcode::Loop_Opcode);
            WriteBeginBlock(this,Loop,(Block *)(pEVar3 + 1),(char *)local_d0.delegate_);
            if (pEVar3->type_ == Loop) goto LAB_0019304d;
          }
          __function = 
          "const Derived *wabt::cast(const Base *) [Derived = wabt::BlockExprBase<wabt::ExprType::Loop>, Base = wabt::Expr]"
          ;
          goto LAB_0019312f;
        }
        if (EVar1 == Try) {
          Opcode::GetInfo((Info *)&local_d0,(Opcode *)&Opcode::Try_Opcode);
          WriteBeginBlock(this,Try,(Block *)(pEVar3 + 1),(char *)local_d0.delegate_);
          WritePuts(this,"(",None);
          WritePuts(this,"do",Newline);
          this->indent_ = this->indent_ + 2;
          FlushExprTreeVector(this,&local_50);
          WriteFoldedExprList(this,(ExprList *)
                                   &pEVar3[5].super_intrusive_list_base<wabt::Expr>.prev_);
          FlushExprTreeStack(this);
          WriteClose(this,Newline);
          if (*(int *)&pEVar3->field_0x3c == 2) {
            WritePuts(this,"(",None);
            Opcode::GetInfo((Info *)&local_d0,(Opcode *)&Opcode::Delegate_Opcode);
            WritePuts(this,(char *)local_d0.delegate_,Space);
            WriteVar(this,(Var *)&pEVar3[6].loc.filename._M_str,None);
            WritePuts(this,")",Newline);
          }
          else if (*(int *)&pEVar3->field_0x3c == 1) {
            pEVar5 = pEVar3[6].super_intrusive_list_base<wabt::Expr>.next_;
            pEVar3 = pEVar3[6].super_intrusive_list_base<wabt::Expr>.prev_;
            if (pEVar5 != pEVar3) {
              exprs = (ExprList *)&pEVar5[1].loc.field_1;
              do {
                WritePuts(this,"(",None);
                if ((*(int *)&exprs[-2].last_ == 0) && ((int)exprs[-2].size_ == -1)) {
                  WritePuts(this,"catch_all",Newline);
                }
                else {
                  Opcode::GetInfo((Info *)&local_d0,(Opcode *)&Opcode::Catch_Opcode);
                  WritePuts(this,(char *)local_d0.delegate_,Space);
                  WriteVar(this,(Var *)(exprs + -3),Newline);
                }
                this->indent_ = this->indent_ + 2;
                WriteFoldedExprList(this,exprs);
                FlushExprTreeStack(this);
                WriteClose(this,Newline);
                pEVar5 = (Expr *)(exprs + 1);
                exprs = (ExprList *)&exprs[5].last_;
              } while (pEVar5 != pEVar3);
            }
          }
          goto LAB_00193067;
        }
LAB_00192f25:
        local_68._vptr_Delegate = (_func_int **)&PTR__Delegate_0022bbf0;
        local_60 = this;
        ExprVisitor::ExprVisitor(&local_d0,&local_68);
        ExprVisitor::VisitExpr(&local_d0,pEVar3);
        if (local_d0.catch_index_stack_.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.catch_index_stack_.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.catch_index_stack_.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.expr_iter_stack_.
            super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.expr_iter_stack_.
                          super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.expr_iter_stack_.
                                super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.expr_stack_.super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.expr_stack_.
                          super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d0.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.expr_stack_.
                                super__Vector_base<wabt::Expr_*,_std::allocator<wabt::Expr_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d0.state_stack_.
            super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d0.state_stack_.
                          super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d0.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d0.state_stack_.
                                super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        this->indent_ = this->indent_ + 2;
        FlushExprTreeVector(this,&local_50);
        expr_trees = (vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
                      *)0x2;
        WriteClose(this,Newline);
      }
      std::
      vector<wabt::(anonymous_namespace)::ExprTree,_std::allocator<wabt::(anonymous_namespace)::ExprTree>_>
      ::~vector(&local_50);
      pEVar6 = pEVar6 + 1;
    } while (pEVar6 != pEVar2);
  }
  return;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnTernaryExpr(TernaryExpr* expr) {
  writer_->WritePutsNewline(expr->opcode.GetName());
  return Result::Ok;
}